

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O3

void compact_suite::test_int64(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  undefined4 local_ac;
  output_type expected [26];
  undefined1 local_8e [6];
  writer writer;
  array<long,_3UL> data;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&writer,&result);
  data._M_elems[0] = 0x7161514131211101;
  data._M_elems[1] = 0x7262524232221202;
  data._M_elems[2] = 0x7363534333231303;
  expected._0_8_ =
       trial::protocol::bintoken::detail::basic_encoder<16UL>::array
                 (&writer.encoder,data._M_elems,3);
  local_ac = 0x1a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.array(data.data(), data.size())","26",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x1a0,"void compact_suite::test_int64()",expected,&local_ac);
  builtin_memcpy(expected + 0x10,"br\x03\x13#3CScs",10);
  expected[0] = 0xae;
  expected[1] = '\x18';
  expected[2] = '\x01';
  expected[3] = '\x11';
  expected[4] = '!';
  expected[5] = '1';
  expected[6] = 'A';
  expected[7] = 'Q';
  expected[8] = 'a';
  expected[9] = 'q';
  expected[10] = '\x02';
  expected[0xb] = '\x12';
  expected[0xc] = '\"';
  expected[0xd] = '2';
  expected[0xe] = 'B';
  expected[0xf] = 'R';
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x1a8,"void compact_suite::test_int64()",
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,local_8e);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&writer.stack);
  (**(code **)writer.encoder.storage._0_8_)(&writer);
  if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}